

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DGXMLScanner::DGXMLScanner
          (DGXMLScanner *this,XMLDocumentHandler *docHandler,DocTypeHandler *docTypeHandler,
          XMLEntityHandler *entityHandler,XMLErrorReporter *errHandler,XMLValidator *valToAdopt,
          GrammarResolver *grammarResolver,MemoryManager *manager)

{
  OutOfMemoryException *anon_var_0;
  undefined1 local_50 [8];
  CleanupType_conflict12 cleanup;
  XMLValidator *valToAdopt_local;
  XMLErrorReporter *errHandler_local;
  XMLEntityHandler *entityHandler_local;
  DocTypeHandler *docTypeHandler_local;
  XMLDocumentHandler *docHandler_local;
  DGXMLScanner *this_local;
  
  cleanup._16_8_ = valToAdopt;
  XMLScanner::XMLScanner
            (&this->super_XMLScanner,docHandler,docTypeHandler,entityHandler,errHandler,valToAdopt,
             grammarResolver,manager);
  (this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler =
       (_func_int **)&PTR__DGXMLScanner_0052f400;
  this->fAttrNSList = (ValueVectorOf<xercesc_4_0::XMLAttr_*> *)0x0;
  this->fDTDValidator = (DTDValidator *)0x0;
  this->fDTDGrammar = (DTDGrammar *)0x0;
  this->fDTDElemNonDeclPool = (NameIdPool<xercesc_4_0::DTDElementDecl> *)0x0;
  this->fElemCount = 0;
  this->fAttDefRegistry = (RefHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher> *)0x0;
  this->fUndeclaredAttrRegistry = (Hash2KeysSetOf<xercesc_4_0::StringHasher> *)0x0;
  JanitorMemFunCall<xercesc_4_0::DGXMLScanner>::JanitorMemFunCall
            ((JanitorMemFunCall<xercesc_4_0::DGXMLScanner> *)local_50,this,(MFPT)cleanUp);
  commonInit(this);
  JanitorMemFunCall<xercesc_4_0::DGXMLScanner>::release
            ((JanitorMemFunCall<xercesc_4_0::DGXMLScanner> *)local_50);
  JanitorMemFunCall<xercesc_4_0::DGXMLScanner>::~JanitorMemFunCall
            ((JanitorMemFunCall<xercesc_4_0::DGXMLScanner> *)local_50);
  return;
}

Assistant:

DGXMLScanner::DGXMLScanner( XMLDocumentHandler* const docHandler
                          , DocTypeHandler* const     docTypeHandler
                          , XMLEntityHandler* const   entityHandler
                          , XMLErrorReporter* const   errHandler
                          , XMLValidator* const       valToAdopt
                          , GrammarResolver* const    grammarResolver
                          , MemoryManager* const      manager) :

    XMLScanner(docHandler, docTypeHandler, entityHandler, errHandler, valToAdopt, grammarResolver, manager)
    , fAttrNSList(0)
    , fDTDValidator(0)
    , fDTDGrammar(0)
    , fDTDElemNonDeclPool(0)
    , fElemCount(0)
    , fAttDefRegistry(0)
    , fUndeclaredAttrRegistry(0)
{
    CleanupType cleanup(this, &DGXMLScanner::cleanUp);

    try
    {
        commonInit();
    }
    catch(const OutOfMemoryException&)
    {
        // Don't cleanup when out of memory, since executing the
        // code can cause problems.
        cleanup.release();

        throw;
    }

    cleanup.release();
}